

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  char cVar10;
  XercesDOMParser *pXVar11;
  ostream *poVar12;
  int iVar13;
  ulong uVar14;
  char *pcVar15;
  TypeInfo ti;
  bool local_53;
  TypeInfo local_50;
  byte local_39;
  XStr local_38;
  
  TypeInfo::TypeInfo(&local_50);
  pXVar11 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)param_2);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar11,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  local_50.parser = pXVar11;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar11);
  bVar1 = SUB81(pXVar11,0);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(bVar1);
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar1);
  xercesc_4_0::AbstractDOMParser::setDoSchema(bVar1);
  xercesc_4_0::AbstractDOMParser::parse((char *)pXVar11);
  local_50.doc = (DOMDocument *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (local_50.doc == (DOMDocument *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"DOMTypeInfo test at line ",0x19);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x35c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"was not carried out",0x13);
    cVar10 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    uVar14 = (ulong)(uint)(int)cVar10;
    std::ostream::put((char)poVar12);
    local_53 = true;
    std::ostream::flush();
  }
  else {
    uVar14 = 1;
    bVar1 = TypeInfo::testInBuiltTypesOnAttributes(&local_50,true);
    bVar2 = TypeInfo::testInBuiltTypesOnElements(&local_50);
    bVar3 = TypeInfo::testSimpleDerived(&local_50);
    bVar4 = TypeInfo::testComplexTypes(&local_50);
    bVar5 = TypeInfo::testUnions(&local_50);
    bVar6 = TypeInfo::testAnonymous(&local_50);
    bVar7 = TypeInfo::testXsiTypes(&local_50);
    bVar8 = TypeInfo::testAnys(&local_50);
    bVar9 = TypeInfo::testInvaild(&local_50);
    local_53 = (bVar8 && bVar9) &&
               (((bVar5 && bVar6) && bVar7) && ((bVar3 && bVar4) && (bVar1 && bVar2)));
  }
  (**(code **)(*(long *)pXVar11 + 8))(pXVar11);
  pXVar11 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,uVar14);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar11,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  local_50.parser = pXVar11;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar11);
  bVar1 = SUB81(pXVar11,0);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(bVar1);
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar1);
  xercesc_4_0::AbstractDOMParser::setDoSchema(bVar1);
  local_38.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("SGXMLScanner",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::AbstractDOMParser::useScanner((wchar16 *)pXVar11);
  XStr::~XStr(&local_38);
  xercesc_4_0::AbstractDOMParser::parse((char *)pXVar11);
  local_50.doc = (DOMDocument *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (local_50.doc == (DOMDocument *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"DOMTypeInfo test at line ",0x19);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x37e);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"was not carried out",0x13);
    cVar10 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    uVar14 = (ulong)(uint)(int)cVar10;
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  else {
    uVar14 = 0;
    bVar1 = TypeInfo::testInBuiltTypesOnAttributes(&local_50,false);
    bVar2 = TypeInfo::testInBuiltTypesOnElements(&local_50);
    bVar3 = TypeInfo::testSimpleDerived(&local_50);
    bVar4 = TypeInfo::testComplexTypes(&local_50);
    local_39 = TypeInfo::testUnions(&local_50);
    bVar5 = TypeInfo::testAnonymous(&local_50);
    bVar6 = TypeInfo::testXsiTypes(&local_50);
    bVar7 = TypeInfo::testAnys(&local_50);
    bVar8 = TypeInfo::testInvaild(&local_50);
    local_53 = (bool)((((bVar5 && bVar6) && bVar7) && bVar8) &
                     (bVar3 && bVar4) & local_39 & ((bVar1 && bVar2) && local_53 != false));
  }
  (**(code **)(*(long *)pXVar11 + 8))(pXVar11);
  pXVar11 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,uVar14);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar11,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  local_50.parser = pXVar11;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar11);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(SUB81(pXVar11,0));
  pcVar15 = "data/TypeInfoJustDTD.xml";
  xercesc_4_0::AbstractDOMParser::parse((char *)pXVar11);
  local_50.doc = (DOMDocument *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (local_50.doc == (DOMDocument *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"DOMTypeInfo test at line ",0x19);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x396);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"was not carried out",0x13);
    cVar10 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    pcVar15 = (char *)(ulong)(uint)(int)cVar10;
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  else {
    bVar1 = TypeInfo::testDTD(&local_50);
    local_53 = (bool)(local_53 & bVar1);
  }
  (**(code **)(*(long *)pXVar11 + 8))(pXVar11);
  pXVar11 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pcVar15);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar11,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  local_50.parser = pXVar11;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar11);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(SUB81(pXVar11,0));
  local_38.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          ("DGXMLScanner",xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  xercesc_4_0::AbstractDOMParser::useScanner((wchar16 *)pXVar11);
  XStr::~XStr(&local_38);
  pcVar15 = "data/TypeInfoJustDTD.xml";
  xercesc_4_0::AbstractDOMParser::parse((char *)pXVar11);
  local_50.doc = (DOMDocument *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (local_50.doc == (DOMDocument *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"DOMTypeInfo test at line ",0x19);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x3af);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"was not carried out",0x13);
    cVar10 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    pcVar15 = (char *)(ulong)(uint)(int)cVar10;
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  else {
    bVar1 = TypeInfo::testDTD(&local_50);
    local_53 = (bool)(local_53 & bVar1);
  }
  (**(code **)(*(long *)pXVar11 + 8))(pXVar11);
  pXVar11 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,(ulong)pcVar15);
  xercesc_4_0::XercesDOMParser::XercesDOMParser
            (pXVar11,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
             (XMLGrammarPool *)0x0);
  local_50.parser = pXVar11;
  xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)pXVar11);
  bVar1 = SUB81(pXVar11,0);
  xercesc_4_0::AbstractDOMParser::setCreateSchemaInfo(bVar1);
  xercesc_4_0::AbstractDOMParser::setDoNamespaces(bVar1);
  xercesc_4_0::AbstractDOMParser::setDoSchema(bVar1);
  xercesc_4_0::AbstractDOMParser::parse((char *)pXVar11);
  local_50.doc = (DOMDocument *)xercesc_4_0::AbstractDOMParser::getDocument();
  if (local_50.doc == (DOMDocument *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"DOMTypeInfo test at line ",0x19);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x3c7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"was not carried out",0x13);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
  }
  else {
    bVar1 = TypeInfo::combinedTest(&local_50);
    local_53 = (bool)(local_53 & bVar1);
  }
  (**(code **)(*(long *)pXVar11 + 8))(pXVar11);
  if (local_53 == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"test failed",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    iVar13 = 4;
    std::ostream::flush();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Test Run Successfully",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    iVar13 = 0;
  }
  xercesc_4_0::XMLPlatformUtils::Terminate();
  return iVar13;
}

Assistant:

int main(int /*argc*/, char ** /*argv*/)
{
    bool passed = true;

    TypeInfo ti;

    try {
        //first the combined DTD/Schema scanner
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->setDoNamespaces(true);
        ti.parser->setDoSchema(true);
        ti.parser->parse("data/TypeInfo.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/TypeInfo.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &= ti.testInBuiltTypesOnAttributes(true);
        passed &= ti.testInBuiltTypesOnElements();
        passed &= ti.testSimpleDerived();
        passed &= ti.testComplexTypes();
        passed &= ti.testUnions();
        passed &= ti.testAnonymous();
        passed &= ti.testXsiTypes();
        passed &= ti.testAnys();
        passed &= ti.testInvaild();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;

    //lets do the same for the just schema scanner
    try {
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->setDoNamespaces(true);
        ti.parser->setDoSchema(true);
        ti.parser->useScanner(X("SGXMLScanner"));
        ti.parser->parse("data/TypeInfoNoDTD.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/TypeInfoNoDTD.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &= ti.testInBuiltTypesOnAttributes(false);
        passed &= ti.testInBuiltTypesOnElements();
        passed &= ti.testSimpleDerived();
        passed &= ti.testComplexTypes();
        passed &= ti.testUnions();
        passed &= ti.testAnonymous();
        passed &= ti.testXsiTypes();
        passed &= ti.testAnys();
        passed &= ti.testInvaild();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;


    //now default for DTD
    try {
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->parse("data/TypeInfoJustDTD.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/TypeInfoJustDTD.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &= ti.testDTD();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;


    //and specific scanner
    try {
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->useScanner(X("DGXMLScanner"));
        ti.parser->parse("data/TypeInfoJustDTD.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/TypeInfoJustDTD.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &=  ti.testDTD();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;

    try {
        ti.parser = new XercesDOMParser;
        ti.parser->setValidationScheme(XercesDOMParser::Val_Auto);
        ti.parser->setCreateSchemaInfo(true);
        ti.parser->setDoNamespaces(true);
        ti.parser->setDoSchema(true);
        ti.parser->parse("data/combined.xml");
        ti.doc = ti.parser->getDocument();
    }
    catch (...) {
        std::cerr << "parsing data/combined.xml failed at line" <<  __LINE__ << std::endl;
        delete ti.parser;
        return false;
    }

    // test only if we got a doc
    if (ti.doc) {
        passed &= ti.combinedTest();
    }
    else
        std::cout << "DOMTypeInfo test at line " << __LINE__ << "was not carried out" << std::endl;

    delete ti.parser;

    if (!passed) {
        std::cerr << "test failed" << std::endl;
        return 4;
    }

    std::cerr << "Test Run Successfully" << std::endl;
    return 0;
}